

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linked_definitions_section.cpp
# Opt level: O1

void __thiscall
LinkedDefinitionsSection_RoundTripForPopulated_Test::TestBody
          (LinkedDefinitionsSection_RoundTripForPopulated_Test *this)

{
  pointer pcVar1;
  transaction<std::unique_lock<mock_mutex>_> *ptVar2;
  element_type *this_00;
  _Alloc_hider _Var3;
  pointer pvVar4;
  undefined4 uVar5;
  database_reference this_01;
  string *psVar6;
  parser<pstore::exchange::import_ns::callbacks> *this_02;
  ostream *poVar7;
  value_reference_type ppVar8;
  linked_definitions *plVar9;
  uint uVar10;
  database *pdVar11;
  _func_int **pp_Var12;
  char *expected_predicate_value;
  pointer *__ptr;
  initializer_list<pstore::repo::linked_definitions::value_type> __l;
  extent<pstore::repo::fragment> x;
  extent<pstore::repo::fragment> x_00;
  initializer_list<pstore::repo::definition> __l_00;
  mock_mutex mutex;
  undefined7 uStack_3ff;
  _Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false> local_3f8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_3f0;
  extent<pstore::repo::fragment> fext;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d8;
  shared_ptr<const_pstore::repo::fragment> imported_fragment;
  undefined1 local_3b8 [31];
  mock_mutex mutex_2;
  shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
  fragments_index;
  __node_base local_388;
  AssertHelper local_360;
  digest imported_digest;
  transaction<std::unique_lock<mock_mutex>_> transaction;
  string exported_json;
  vector<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>
  exported_content;
  const_iterator pos;
  pair<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>::iterator_base<false>,_bool>
  local_128;
  
  pos.visited_parents_.c_._M_elems[2].position = 1;
  pos.visited_parents_.c_._M_elems[3].node = (index_pointer)0xffffffffffffffff;
  pos.visited_parents_.c_._M_elems[1].position = 0x9abcdef0;
  pos.visited_parents_.c_._M_elems[2].node.internal_ = (internal_node *)0x12345678;
  pos.visited_parents_.c_._M_elems._8_16_ = ZEXT816(0xffffffffffffffff) << 0x40;
  pos.db_ = (database_reference)0x9abcdef0;
  pos.visited_parents_.c_._M_elems[0].node.internal_ = (internal_node *)0x12345678;
  __l._M_len = 2;
  __l._M_array = (iterator)&pos;
  std::
  vector<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>
  ::vector(&exported_content,__l,(allocator_type *)&transaction);
  pvVar4 = exported_content.
           super__Vector_base<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pos.db_ = (database_reference)&mutex;
  pos.visited_parents_.c_._M_elems[0].node.internal_ =
       pos.visited_parents_.c_._M_elems[0].node.internal_ & 0xffffffffffffff00;
  std::unique_lock<mock_mutex>::lock((unique_lock<mock_mutex> *)&pos);
  pdVar11 = &(this->super_LinkedDefinitionsSection).export_db_;
  pos.visited_parents_.c_._M_elems[0].node.addr_.a_._0_1_ = 1;
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            (&transaction,pdVar11,(lock_type *)&pos);
  if ((pos.visited_parents_.c_._M_elems[0].node.addr_.a_._0_1_ == '\x01') &&
     (pos.db_ != (database_reference)0x0)) {
    pos.visited_parents_.c_._M_elems[0].node.internal_ =
         pos.visited_parents_.c_._M_elems[0].node.internal_ & 0xffffffffffffff00;
  }
  imported_fragment.super___shared_ptr<const_pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  imported_fragment.super___shared_ptr<const_pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_3b8[0] = '\0';
  local_3b8[1] = '\0';
  local_3b8[2] = '\0';
  local_3b8[3] = '\0';
  local_3b8[4] = '\0';
  local_3b8[5] = '\0';
  local_3b8[6] = '\0';
  local_3b8[7] = '\0';
  this_01 = (database_reference)operator_new(0x20);
  pstore::repo::linked_definitions_creation_dispatcher::linked_definitions_creation_dispatcher
            ((linked_definitions_creation_dispatcher *)this_01,pvVar4,
             exported_content.
             super__Vector_base<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  pos.db_ = this_01;
  if (imported_fragment.super___shared_ptr<const_pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b8._0_8_) {
    std::
    vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>
    ::_M_realloc_insert<pstore::repo::linked_definitions_creation_dispatcher*>
              ((vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>
                *)&imported_fragment,
               (iterator)
               imported_fragment.
               super___shared_ptr<const_pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi,(linked_definitions_creation_dispatcher **)&pos);
  }
  else {
    (imported_fragment.super___shared_ptr<const_pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2>.
     _M_refcount._M_pi)->_vptr__Sp_counted_base = (_func_int **)this_01;
    imported_fragment.super___shared_ptr<const_pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         &(imported_fragment.
           super___shared_ptr<const_pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count;
  }
  fext = pstore::repo::fragment::
         alloc<pstore::transaction<std::unique_lock<mock_mutex>>,pstore::pointee_adaptor<__gnu_cxx::__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>*,std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>>>
                   (&transaction,
                    (pointee_adaptor<__gnu_cxx::__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_*,_std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
                     )imported_fragment.
                      super___shared_ptr<const_pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,(pointee_adaptor<__gnu_cxx::__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_*,_std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
                              )imported_fragment.
                               super___shared_ptr<const_pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi);
  pstore::transaction_base::commit(&transaction.super_transaction_base);
  pstore::exchange::export_ns::string_mapping::string_mapping<(pstore::trailer::indices)3>
            ((string_mapping *)&fragments_index,pdVar11);
  pstore::exchange::export_ns::ostream_base::ostream_base((ostream_base *)&pos,0x1000);
  pos.visited_parents_.c_._M_elems[2].position =
       (size_t)&pos.visited_parents_.c_._M_elems[3].position;
  pos.db_ = (database_reference)&PTR__ostringstream_00243498;
  pos.visited_parents_.c_._M_elems[3].node.internal_ = (internal_node *)0x0;
  pos.visited_parents_.c_._M_elems[3].position._0_1_ = 0;
  pstore::database::getro<pstore::repo::fragment,void>
            ((database *)&imported_digest,(extent<pstore::repo::fragment> *)pdVar11);
  pstore::exchange::export_ns::emit_fragment
            ((ostream_base *)&pos,(indent)0x0,pdVar11,(string_mapping *)&fragments_index,
             (shared_ptr<const_pstore::repo::fragment> *)&imported_digest,true);
  if (imported_digest.v_._8_8_ != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(imported_digest.v_._8_8_);
  }
  psVar6 = pstore::exchange::export_ns::ostringstream::str_abi_cxx11_((ostringstream *)&pos);
  pcVar1 = (psVar6->_M_dataplus)._M_p;
  exported_json._M_dataplus._M_p = (pointer)&exported_json.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&exported_json,pcVar1,pcVar1 + psVar6->_M_string_length);
  pstore::exchange::export_ns::ostringstream::~ostringstream((ostringstream *)&pos);
  std::
  _Hashtable<pstore::address,_std::pair<const_pstore::address,_unsigned_long>,_std::allocator<std::pair<const_pstore::address,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<pstore::address>,_std::hash<pstore::address>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<pstore::address,_std::pair<const_pstore::address,_unsigned_long>,_std::allocator<std::pair<const_pstore::address,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<pstore::address>,_std::hash<pstore::address>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&fragments_index);
  std::
  vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  ::~vector((vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
             *)&imported_fragment);
  transaction.super_transaction_base._vptr_transaction_base =
       (_func_int **)&PTR__transaction_0023bdb8;
  pstore::transaction_base::rollback(&transaction.super_transaction_base);
  if ((transaction.lock_._M_owns == true) && (transaction.lock_._M_device != (mutex_type *)0x0)) {
    transaction.lock_._8_8_ = transaction.lock_._8_8_ & 0xffffffffffffff00;
  }
  pos.visited_parents_.c_._M_elems[0].node.internal_ =
       pos.visited_parents_.c_._M_elems[0].node.internal_ & 0xffffffffffffff00;
  pos.db_ = (database_reference)&fext;
  std::unique_lock<mock_mutex>::lock((unique_lock<mock_mutex> *)&pos);
  pdVar11 = &(this->super_LinkedDefinitionsSection).import_db_;
  pos.visited_parents_.c_._M_elems[0].node.addr_.a_._0_1_ = 1;
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            (&transaction,pdVar11,(lock_type *)&pos);
  if ((pos.visited_parents_.c_._M_elems[0].node.addr_.a_._0_1_ == '\x01') &&
     (pos.db_ != (database_reference)0x0)) {
    pos.visited_parents_.c_._M_elems[0].node.internal_ =
         pos.visited_parents_.c_._M_elems[0].node.internal_ & 0xffffffffffffff00;
  }
  x.size = 0x9abcdef0;
  x.addr.a_.a_ = (address)0x12345678;
  pstore::repo::definition::definition
            ((definition *)&pos,(digest)ZEXT816(4),x,(typed_address<pstore::indirect_string>)0x0,
             internal_no_symbol,default_vis);
  expected_predicate_value = (char *)0x0;
  x_00.size = 0x9abcdef0;
  x_00.addr.a_.a_ = (address)0x12345678;
  pstore::repo::definition::definition
            ((definition *)&pos.visited_parents_.c_._M_elems[2].position,(digest)ZEXT816(4),x_00,
             (typed_address<pstore::indirect_string>)0x0,internal_no_symbol,default_vis);
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&pos;
  std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>::vector
            ((vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_> *)
             &fragments_index,__l_00,(allocator_type *)&imported_fragment);
  pstore::index::
  get_index<(pstore::trailer::indices)0,pstore::database,pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
            ((index *)&imported_fragment,transaction.super_transaction_base.db_,true);
  this_00 = imported_fragment.
            super___shared_ptr<const_pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pos.visited_parents_.c_._M_elems._8_16_ =
       pstore::repo::compilation::
       alloc<pstore::transaction<std::unique_lock<mock_mutex>>,__gnu_cxx::__normal_iterator<pstore::repo::definition*,std::vector<pstore::repo::definition,std::allocator<pstore::repo::definition>>>>
                 (&transaction,(typed_address<pstore::indirect_string>)0x0,
                  (__normal_iterator<pstore::repo::definition_*,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_>
                   )fragments_index.
                    super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr,
                  (__normal_iterator<pstore::repo::definition_*,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_>
                   )fragments_index.
                    super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi);
  pos.db_ = (database_reference)0x9abcdef0;
  pos.visited_parents_.c_._M_elems[0].node.internal_ = (internal_node *)0x12345678;
  pstore::index::
  hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
  ::insert_or_upsert<std::pair<pstore::uint128,pstore::extent<pstore::repo::compilation>>>
            (&local_128,
             (hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
              *)this_00,&transaction.super_transaction_base,
             (pair<pstore::uint128,_pstore::extent<pstore::repo::compilation>_> *)&pos,false);
  if (local_128.first.pos_._M_t.
      super___uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_*,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
      .
      super__Head_base<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
       )0x0) {
    operator_delete((void *)local_128.first.pos_._M_t.
                            super___uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_*,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
                            .
                            super__Head_base<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_*,_false>
                            ._M_head_impl,0x20);
  }
  local_128.first.pos_._M_t.
  super___uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_*,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
  .
  super__Head_base<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
          )0x0;
  if (imported_fragment.super___shared_ptr<const_pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (imported_fragment.
               super___shared_ptr<const_pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (fragments_index.
      super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)0x0) {
    operator_delete(fragments_index.
                    super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr,(long)local_388._M_nxt -
                            (long)fragments_index.
                                  super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr);
  }
  pstore::transaction_base::commit(&transaction.super_transaction_base);
  transaction.super_transaction_base._vptr_transaction_base =
       (_func_int **)&PTR__transaction_0023bdb8;
  pstore::transaction_base::rollback(&transaction.super_transaction_base);
  if ((transaction.lock_._M_owns == true) && (transaction.lock_._M_device != (mutex_type *)0x0)) {
    transaction.lock_._8_8_ = transaction.lock_._8_8_ & 0xffffffffffffff00;
  }
  imported_digest.v_._0_8_ = 0x9abcdef0;
  imported_digest.v_._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x31415192;
  pos.db_ = (database_reference)&mutex_2;
  pos.visited_parents_.c_._M_elems[0].node.internal_ =
       pos.visited_parents_.c_._M_elems[0].node.internal_ & 0xffffffffffffff00;
  std::unique_lock<mock_mutex>::lock((unique_lock<mock_mutex> *)&pos);
  pos.visited_parents_.c_._M_elems[0].node.addr_.a_._0_1_ = 1;
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)&fragments_index,pdVar11,
             (lock_type *)&pos);
  if ((pos.visited_parents_.c_._M_elems[0].node.addr_.a_._0_1_ == '\x01') &&
     (pos.db_ != (database_reference)0x0)) {
    pos.visited_parents_.c_._M_elems[0].node.internal_ =
         pos.visited_parents_.c_._M_elems[0].node.internal_ & 0xffffffffffffff00;
  }
  transaction.super_transaction_base.dbsize_ = (uint64_t)&transaction.super_transaction_base.dbsize_
  ;
  transaction.super_transaction_base.size_ = 0;
  transaction.super_transaction_base._vptr_transaction_base = (_func_int **)0x0;
  transaction.super_transaction_base.db_ = (database *)0x0;
  transaction.lock_._M_device = (mutex_type *)0x0;
  transaction.lock_._8_8_ = &transaction.lock_._M_owns;
  _mutex = pdVar11;
  transaction.super_transaction_base.first_.a_ = transaction.super_transaction_base.dbsize_;
  pstore::gsl::not_null<pstore::database_*>::ensure_invariant
            ((not_null<pstore::database_*> *)&mutex);
  pstore::exchange::import_ns::callbacks::
  make<pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::fragment_sections,pstore::transaction<std::unique_lock<mock_mutex>>*,pstore::exchange::import_ns::string_mapping*,pstore::uint128_const*>,pstore::transaction<std::unique_lock<mock_mutex>>*,pstore::exchange::import_ns::string_mapping*,pstore::uint128_const*>
            ((callbacks *)&fext,_mutex,
             (transaction<std::unique_lock<mock_mutex>_> *)&fragments_index,
             (string_mapping *)&transaction,&imported_digest);
  imported_fragment.super___shared_ptr<const_pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)fext.addr.a_.a_;
  imported_fragment.super___shared_ptr<const_pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)fext.size;
  if (fext.size != 0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(fext.size + 8) = *(int *)(fext.size + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(fext.size + 8) = *(int *)(fext.size + 8) + 1;
    }
  }
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::parser
            ((parser<pstore::exchange::import_ns::callbacks> *)&pos,(callbacks *)&imported_fragment,
             none);
  if (imported_fragment.super___shared_ptr<const_pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (imported_fragment.
               super___shared_ptr<const_pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (fext.size != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)fext.size);
  }
  _Var3._M_p = exported_json._M_dataplus._M_p;
  pstore::gsl::details::extent_type<-1L>::extent_type
            ((extent_type<_1L> *)&imported_fragment,exported_json._M_string_length);
  imported_fragment.super___shared_ptr<const_pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var3._M_p;
  this_02 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::
            input<pstore::gsl::span<char_const,_1l>>
                      ((parser<pstore::exchange::import_ns::callbacks> *)&pos,
                       (span<const_char,__1L> *)&imported_fragment);
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::eof(this_02);
  uVar5 = pos.visited_parents_.c_._M_elems[5].node.addr_.a_._0_4_;
  _mutex = (database *)
           CONCAT71(uStack_3ff,pos.visited_parents_.c_._M_elems[5].node.addr_.a_._0_4_ == 0);
  local_3f8._M_head_impl = (array<pstore::sat_entry,_65536UL> *)0x0;
  if (pos.visited_parents_.c_._M_elems[5].node.addr_.a_._0_4_ == 0) {
    pstore::exchange::import_ns::context::apply_patches
              ((context *)pos.visited_parents_.c_._M_elems[6].node.internal_,
               (transaction_base *)&fragments_index);
    if ((size_t *)pos.visited_parents_.c_._M_elems[7].position !=
        &pos.visited_parents_.c_._M_elems[8].position) {
      operator_delete((void *)pos.visited_parents_.c_._M_elems[7].position,
                      pos.visited_parents_.c_._M_elems[8].position + 1);
    }
    if (pos.visited_parents_.c_._M_elems[6].position != 0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 pos.visited_parents_.c_._M_elems[6].position);
    }
    std::
    deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
    ::~deque((deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
              *)&pos.visited_parents_);
    if (pos.db_ != (database_reference)0x0) {
      operator_delete(pos.db_,0x68);
    }
    pstore::exchange::import_ns::string_mapping::~string_mapping((string_mapping *)&transaction);
    pstore::transaction_base::commit((transaction_base *)&fragments_index);
  }
  else {
    testing::Message::Message((Message *)&local_3f0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_3f0._M_head_impl + 0x10),"JSON error was: ",0x10);
    (**(code **)(*(long *)pos.visited_parents_.c_._M_elems[5].position + 0x20))
              (&imported_fragment,pos.visited_parents_.c_._M_elems[5].position,
               pos.visited_parents_.c_._M_elems[5].node.addr_.a_._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_3f0._M_head_impl + 0x10),
               (char *)imported_fragment.
                       super___shared_ptr<const_pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,
               (long)imported_fragment.
                     super___shared_ptr<const_pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
    fext.addr.a_.a_._0_1_ = 0x20;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_3f0._M_head_impl + 0x10),(char *)&fext,1);
    fext.addr.a_.a_._0_1_ = 0x28;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)(local_3f0._M_head_impl + 0x10),(char *)&fext,1);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    fext.addr.a_.a_._0_1_ = 0x3a;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&fext,1);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    fext.addr.a_.a_._0_1_ = 0x29;
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&fext,1);
    fext.addr.a_.a_._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_3f0._M_head_impl + 0x10),(char *)&fext,1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_3f0._M_head_impl + 0x10),exported_json._M_dataplus._M_p,
               exported_json._M_string_length);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&fext,(internal *)&mutex,(AssertionResult *)0x1df922,"true","false",
               expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_360,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_linked_definitions_section.cpp"
               ,0xaf,(char *)fext.addr.a_.a_);
    testing::internal::AssertHelper::operator=(&local_360,(Message *)&local_3f0);
    testing::internal::AssertHelper::~AssertHelper(&local_360);
    if (fext.addr.a_.a_ != (address)&local_3d8) {
      operator_delete((void *)fext.addr.a_.a_,(ulong)(local_3d8._M_allocated_capacity + 1));
    }
    if (imported_fragment.
        super___shared_ptr<const_pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)local_3b8) {
      operator_delete(imported_fragment.
                      super___shared_ptr<const_pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,(ulong)(local_3b8._0_8_ + 1));
    }
    if (local_3f0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (*(*(_func_int ***)local_3f0._M_head_impl)[1])();
    }
    if (local_3f8._M_head_impl != (array<pstore::sat_entry,_65536UL> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_3f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_3f8._M_head_impl);
    }
    if ((size_t *)pos.visited_parents_.c_._M_elems[7].position !=
        &pos.visited_parents_.c_._M_elems[8].position) {
      operator_delete((void *)pos.visited_parents_.c_._M_elems[7].position,
                      pos.visited_parents_.c_._M_elems[8].position + 1);
    }
    if (pos.visited_parents_.c_._M_elems[6].position != 0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 pos.visited_parents_.c_._M_elems[6].position);
    }
    std::
    deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
    ::~deque((deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
              *)&pos.visited_parents_);
    if (pos.db_ != (database_reference)0x0) {
      operator_delete(pos.db_,0x68);
    }
    pstore::exchange::import_ns::string_mapping::~string_mapping((string_mapping *)&transaction);
  }
  fragments_index.
  super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)&PTR__transaction_0023bdb8;
  pstore::transaction_base::rollback((transaction_base *)&fragments_index);
  if (uVar5 != 0) goto LAB_00176095;
  pstore::index::
  get_index<(pstore::trailer::indices)2,pstore::database,pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
            ((index *)&fragments_index,pdVar11,true);
  pstore::index::
  hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
  ::find<pstore::uint128,void>
            (&pos,(hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
                   *)fragments_index.
                     super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,pdVar11,&imported_digest);
  memset(&transaction.super_transaction_base.db_,0,0xd8);
  transaction.super_transaction_base._vptr_transaction_base = (_func_int **)pdVar11;
  testing::internal::
  CmpHelperNE<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>::iterator_base<true>,pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>::iterator_base<false>>
            ((internal *)&imported_fragment,"pos","fragments_index->end (import_db_)",&pos,
             (iterator_base<false> *)&transaction);
  if ((char)imported_fragment.
            super___shared_ptr<const_pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      '\0') {
    testing::Message::Message((Message *)&transaction);
    if (imported_fragment.
        super___shared_ptr<const_pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pp_Var12 = (_func_int **)0x1ecb0f;
    }
    else {
      pp_Var12 = (imported_fragment.
                  super___shared_ptr<const_pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_vptr__Sp_counted_base;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&fext,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_linked_definitions_section.cpp"
               ,0xbd,(char *)pp_Var12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&fext,(Message *)&transaction);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&fext);
    if (transaction.super_transaction_base._vptr_transaction_base != (_func_int **)0x0) {
      (**(code **)(*transaction.super_transaction_base._vptr_transaction_base + 8))();
    }
    if (imported_fragment.
        super___shared_ptr<const_pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&imported_fragment.
                       super___shared_ptr<const_pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   imported_fragment.
                   super___shared_ptr<const_pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
    }
  }
  else {
    if (imported_fragment.
        super___shared_ptr<const_pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&imported_fragment.
                       super___shared_ptr<const_pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   imported_fragment.
                   super___shared_ptr<const_pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
    }
    ppVar8 = pstore::index::
             hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
             ::iterator_base<true>::operator*(&pos);
    pstore::repo::fragment::load((fragment *)&imported_fragment,pdVar11,&ppVar8->second);
    uVar10 = ((imported_fragment.
               super___shared_ptr<const_pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->arr_).sa_.bitmap_ & 0x40000;
    fext.addr.a_.a_._0_1_ = (char)(uVar10 >> 0x12);
    fext.size = 0;
    if (uVar10 == 0) {
      ptVar2 = (transaction<std::unique_lock<mock_mutex>_> *)&fext;
      testing::Message::Message((Message *)&mutex);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&transaction,(internal *)&fext,
                 (AssertionResult *)
                 "imported_fragment->has_section (repo::section_kind::linked_definitions)","false",
                 "true",expected_predicate_value);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_3f0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_linked_definitions_section.cpp"
                 ,0xbf,(char *)transaction.super_transaction_base._vptr_transaction_base);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_3f0,(Message *)&mutex);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3f0);
      if (transaction.super_transaction_base._vptr_transaction_base !=
          (_func_int **)&transaction.super_transaction_base.size_) {
        operator_delete(transaction.super_transaction_base._vptr_transaction_base,
                        transaction.super_transaction_base.size_ + 1);
      }
      if (_mutex != (database *)0x0) {
        (**(code **)(*(_func_int **)_mutex + 8))();
      }
      pdVar11 = (database *)fext.size;
      if (fext.size != 0) {
LAB_00175dc8:
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&(ptVar2->super_transaction_base).db_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pdVar11);
      }
    }
    else {
      plVar9 = pstore::repo::fragment::
               at_impl<(pstore::repo::section_kind)18,pstore::repo::fragment_const&,pstore::repo::linked_definitions_const>
                         (imported_fragment.
                          super___shared_ptr<const_pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr);
      fext.addr.a_.a_ = (address)(address)plVar9->size_;
      _mutex = (database *)CONCAT44(uStack_3ff._3_4_,2);
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
                ((internal *)&transaction,"linked.size ()","2U",(unsigned_long *)&fext,
                 (uint *)&mutex);
      if ((char)transaction.super_transaction_base._vptr_transaction_base == '\0') {
        testing::Message::Message((Message *)&fext);
        if (transaction.super_transaction_base.db_ == (database *)0x0) {
          pp_Var12 = (_func_int **)0x1ecb0f;
        }
        else {
          pp_Var12 = (transaction.super_transaction_base.db_)->_vptr_database;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&mutex,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_linked_definitions_section.cpp"
                   ,0xc2,(char *)pp_Var12);
        testing::internal::AssertHelper::operator=((AssertHelper *)&mutex,(Message *)&fext);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mutex);
        if (fext.addr.a_.a_ != 0) {
          (**(code **)(*(long *)fext.addr.a_.a_ + 8))();
        }
        if (transaction.super_transaction_base.db_ != (database *)0x0) {
          ptVar2 = &transaction;
          pdVar11 = transaction.super_transaction_base.db_;
          goto LAB_00175dc8;
        }
      }
      else {
        if (transaction.super_transaction_base.db_ != (database *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&transaction.super_transaction_base.db_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       transaction.super_transaction_base.db_);
        }
        pvVar4 = exported_content.
                 super__Vector_base<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        testing::internal::CmpHelperEQ<pstore::uint128,pstore::uint128>
                  ((internal *)&transaction,"expos->compilation","impos->compilation",
                   &(exported_content.
                     super__Vector_base<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>
                     ._M_impl.super__Vector_impl_data._M_start)->compilation,
                   &plVar9->definitions_[0].compilation);
        if ((char)transaction.super_transaction_base._vptr_transaction_base == '\0') {
          testing::Message::Message((Message *)&fext);
          if (transaction.super_transaction_base.db_ == (database *)0x0) {
            pp_Var12 = (_func_int **)0x1ecb0f;
          }
          else {
            pp_Var12 = (transaction.super_transaction_base.db_)->_vptr_database;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&mutex,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_linked_definitions_section.cpp"
                     ,0xc5,(char *)pp_Var12);
          testing::internal::AssertHelper::operator=((AssertHelper *)&mutex,(Message *)&fext);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mutex);
          if (fext.addr.a_.a_ != 0) {
            (**(code **)(*(long *)fext.addr.a_.a_ + 8))();
          }
        }
        if (transaction.super_transaction_base.db_ != (database *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&transaction.super_transaction_base.db_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       transaction.super_transaction_base.db_);
        }
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                  ((internal *)&transaction,"expos->index","impos->index",&pvVar4->index,
                   &plVar9->definitions_[0].index);
        if ((char)transaction.super_transaction_base._vptr_transaction_base == '\0') {
          testing::Message::Message((Message *)&fext);
          if (transaction.super_transaction_base.db_ == (database *)0x0) {
            pp_Var12 = (_func_int **)0x1ecb0f;
          }
          else {
            pp_Var12 = (transaction.super_transaction_base.db_)->_vptr_database;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&mutex,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_linked_definitions_section.cpp"
                     ,0xc6,(char *)pp_Var12);
          testing::internal::AssertHelper::operator=((AssertHelper *)&mutex,(Message *)&fext);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mutex);
          if (fext.addr.a_.a_ != 0) {
            (**(code **)(*(long *)fext.addr.a_.a_ + 8))();
          }
        }
        if (transaction.super_transaction_base.db_ != (database *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&transaction.super_transaction_base.db_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       transaction.super_transaction_base.db_);
        }
        anon_unknown.dwarf_32b84a::check_linked_definition(pdVar11,plVar9->definitions_);
        testing::internal::CmpHelperEQ<pstore::uint128,pstore::uint128>
                  ((internal *)&transaction,"expos->compilation","impos->compilation",
                   &pvVar4[1].compilation,(uint128 *)(plVar9 + 1));
        if ((char)transaction.super_transaction_base._vptr_transaction_base == '\0') {
          testing::Message::Message((Message *)&fext);
          if (transaction.super_transaction_base.db_ == (database *)0x0) {
            pp_Var12 = (_func_int **)0x1ecb0f;
          }
          else {
            pp_Var12 = (transaction.super_transaction_base.db_)->_vptr_database;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&mutex,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_linked_definitions_section.cpp"
                     ,0xca,(char *)pp_Var12);
          testing::internal::AssertHelper::operator=((AssertHelper *)&mutex,(Message *)&fext);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mutex);
          if (fext.addr.a_.a_ != 0) {
            (**(code **)(*(long *)fext.addr.a_.a_ + 8))();
          }
        }
        if (transaction.super_transaction_base.db_ != (database *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&transaction.super_transaction_base.db_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       transaction.super_transaction_base.db_);
        }
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                  ((internal *)&transaction,"expos->index","impos->index",&pvVar4[1].index,
                   (uint *)plVar9[1].definitions_);
        if ((char)transaction.super_transaction_base._vptr_transaction_base == '\0') {
          testing::Message::Message((Message *)&fext);
          if (transaction.super_transaction_base.db_ == (database *)0x0) {
            pp_Var12 = (_func_int **)0x1ecb0f;
          }
          else {
            pp_Var12 = (transaction.super_transaction_base.db_)->_vptr_database;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&mutex,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_linked_definitions_section.cpp"
                     ,0xcb,(char *)pp_Var12);
          testing::internal::AssertHelper::operator=((AssertHelper *)&mutex,(Message *)&fext);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mutex);
          if (fext.addr.a_.a_ != 0) {
            (**(code **)(*(long *)fext.addr.a_.a_ + 8))();
          }
        }
        if (transaction.super_transaction_base.db_ != (database *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&transaction.super_transaction_base.db_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       transaction.super_transaction_base.db_);
        }
        anon_unknown.dwarf_32b84a::check_linked_definition(pdVar11,(value_type *)(plVar9 + 1));
      }
    }
    if (imported_fragment.
        super___shared_ptr<const_pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (imported_fragment.
                 super___shared_ptr<const_pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  if ((__uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>_>_>
       )pos.pos_._M_t.
        super___uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>_*,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>_>_>
        .
        super__Head_base<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>_*,_false>
        ._M_head_impl !=
      (__uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>_>_>
       )0x0) {
    operator_delete((void *)pos.pos_._M_t.
                            super___uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>_*,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>_>_>
                            .
                            super__Head_base<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>_*,_false>
                            ._M_head_impl,0x20);
  }
  if (fragments_index.
      super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (fragments_index.
               super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
LAB_00176095:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)exported_json._M_dataplus._M_p != &exported_json.field_2) {
    operator_delete(exported_json._M_dataplus._M_p,exported_json.field_2._M_allocated_capacity + 1);
  }
  if (exported_content.
      super__Vector_base<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(exported_content.
                    super__Vector_base<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)exported_content.
                          super__Vector_base<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)exported_content.
                          super__Vector_base<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST_F (LinkedDefinitionsSection, RoundTripForPopulated) {
    using testing::ContainerEq;
    constexpr auto referenced_compilation_digest = pstore::index::digest{0x12345678, 0x9ABCDEF0};

    constexpr auto max_addr =
        typed_address<repo::definition>::make (std::numeric_limits<std::uint64_t>::max ());
    std::vector<repo::linked_definitions::value_type> exported_content{
        {referenced_compilation_digest, UINT32_C (0), max_addr},
        {referenced_compilation_digest, UINT32_C (1), max_addr},
    };

    // Build and export a fragment which contains a linked-definitions section with the contents
    // supplied from the export_content vector. The resulting JSON is in exported_json.
    std::string exported_json = this->export_fragment (
        exported_content.data (), exported_content.data () + exported_content.size ());

    // Now build the import database. First we we create a compilation that the linked-definition
    // fragment will later reference.
    {
        mock_mutex mutex;
        auto transaction = begin (import_db_, transaction_lock{mutex});
        {
            constexpr index::digest fragment_digest{0x9ABCDEF0, 0x12345678};
            pstore::extent<repo::fragment> const fext;
            constexpr auto str = pstore::typed_address<pstore::indirect_string>::make (0U);
            std::vector<repo::definition> definitions{
                {fragment_digest, fext, str, pstore::repo::linkage::external},
                {fragment_digest, fext, str, pstore::repo::linkage::external},
            };
            auto compilation_index =
                pstore::index::get_index<pstore::trailer::indices::compilation> (transaction.db ());
            compilation_index->insert (
                transaction, std::make_pair (referenced_compilation_digest,
                                             repo::compilation::alloc (transaction, str /*triple*/,
                                                                       std::begin (definitions),
                                                                       std::end (definitions))));
        }
        transaction.commit ();
    }

    constexpr auto imported_digest = pstore::index::digest{0x31415192, 0x9ABCDEF0};
    {
        mock_mutex mutex;
        auto transaction = begin (import_db_, transaction_lock{mutex});
        {
            exchange::import_ns::string_mapping imported_names;
            auto parser = make_json_object_parser<exchange::import_ns::fragment_sections> (
                &import_db_, &transaction, &imported_names, &imported_digest);
            parser.input (exported_json).eof ();
            ASSERT_FALSE (parser.has_error ())
                << "JSON error was: " << parser.last_error ().message () << ' '
                << parser.coordinate () << '\n'
                << exported_json;

            std::shared_ptr<exchange::import_ns::context> const & ctxt =
                parser.callbacks ().get_context ();
            ctxt->apply_patches (&transaction);
        }
        transaction.commit ();
    }

    auto fragments_index = index::get_index<trailer::indices::fragment> (import_db_);
    auto pos = fragments_index->find (import_db_, imported_digest);
    ASSERT_NE (pos, fragments_index->end (import_db_));
    auto imported_fragment = repo::fragment::load (import_db_, pos->second);
    ASSERT_TRUE (imported_fragment->has_section (repo::section_kind::linked_definitions));
    repo::linked_definitions const & linked =
        imported_fragment->at<repo::section_kind::linked_definitions> ();
    ASSERT_EQ (linked.size (), 2U);
    auto expos = exported_content.begin ();
    auto impos = linked.begin ();
    EXPECT_EQ (expos->compilation, impos->compilation);
    EXPECT_EQ (expos->index, impos->index);
    check_linked_definition (import_db_, *impos);
    ++expos;
    ++impos;
    EXPECT_EQ (expos->compilation, impos->compilation);
    EXPECT_EQ (expos->index, impos->index);
    check_linked_definition (import_db_, *impos);
}